

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O1

void ProcessEDSectors(void)

{
  size_t __n;
  int recordnum;
  sector_t_conflict *psVar1;
  hash_t hVar2;
  void *__s;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  InitED();
  hVar2 = TMap<int,_EDSector,_THashTraits<int>,_TValueTraits<EDSector>_>::CountUsed(&EDSectors);
  if (hVar2 != 0) {
    __n = (long)numsectors * 4;
    uVar5 = 0xffffffffffffffff;
    if (-1 < (long)numsectors) {
      uVar5 = __n;
    }
    __s = operator_new__(uVar5);
    memset(__s,0xff,__n);
    psVar1 = sectors;
    if (0 < numlines) {
      piVar3 = &lines->special;
      lVar4 = 0;
      do {
        if ((*piVar3 == 0xbe) && (piVar3[2] == 0xfd)) {
          *(int *)((long)__s +
                  ((long)*(sector_t_conflict **)(piVar3 + 0x14) - (long)psVar1 >> 1) *
                  -0xf4898d5f85bb395) = piVar3[1];
          *piVar3 = 0;
        }
        lVar4 = lVar4 + 1;
        piVar3 = piVar3 + 0x26;
      } while (lVar4 < numlines);
    }
    if (0 < numsectors) {
      lVar6 = 0;
      lVar4 = 0;
      do {
        recordnum = *(int *)((long)__s + lVar4 * 4);
        if (-1 < recordnum) {
          ProcessEDSector((sector_t_conflict *)((long)&sectors->planes[0].xform.xOffs + lVar6),
                          recordnum);
        }
        lVar4 = lVar4 + 1;
        lVar6 = lVar6 + 0x218;
      } while (lVar4 < numsectors);
    }
    operator_delete__(__s);
    return;
  }
  return;
}

Assistant:

void ProcessEDSectors()
{
	int i;

	InitED();
	if (EDSectors.CountUsed() == 0) return;	// don't waste time if there's no records.

	// collect all Extradata sector records up front so we do not need to search the complete line array for each sector separately.
	int *sectorrecord = new int[numsectors];
	memset(sectorrecord, -1, numsectors * sizeof(int));
	for (i = 0; i < numlines; i++)
	{
		if (lines[i].special == Static_Init && lines[i].args[1] == Init_EDSector)
		{
			sectorrecord[lines[i].frontsector - sectors] = lines[i].args[0];
			lines[i].special = 0;
		}
	}
	for (i = 0; i < numsectors; i++)
	{
		if (sectorrecord[i] >= 0)
		{
			ProcessEDSector(&sectors[i], sectorrecord[i]);
		}
	}
	delete[] sectorrecord;
}